

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O0

void flecs::_::name_util::trim_name(char *typeName)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  ecs_size_t class_len;
  ecs_size_t struct_len;
  ecs_size_t const_len;
  ecs_size_t len;
  char *typeName_local;
  
  sVar2 = strlen(typeName);
  struct_len = (ecs_size_t)sVar2;
  if ((6 < struct_len) && (iVar1 = strncmp(typeName,"const ",6), iVar1 == 0)) {
    memmove(typeName,typeName + 6,(long)(struct_len + -6));
    typeName[struct_len + -6] = '\0';
    struct_len = struct_len + -6;
  }
  if ((7 < struct_len) && (iVar1 = strncmp(typeName,"struct ",7), iVar1 == 0)) {
    memmove(typeName,typeName + 7,(long)(struct_len + -7));
    typeName[struct_len + -7] = '\0';
    struct_len = struct_len + -7;
  }
  if ((6 < struct_len) && (iVar1 = strncmp(typeName,"class ",6), iVar1 == 0)) {
    memmove(typeName,typeName + 6,(long)(struct_len + -6));
    typeName[struct_len + -6] = '\0';
    struct_len = struct_len + -6;
  }
  while( true ) {
    bVar3 = true;
    if ((typeName[struct_len + -1] != ' ') && (bVar3 = true, typeName[struct_len + -1] != '&')) {
      bVar3 = typeName[struct_len + -1] == '*';
    }
    if (!bVar3) break;
    struct_len = struct_len + -1;
    typeName[struct_len] = '\0';
  }
  if ((6 < struct_len) && (iVar1 = strncmp(typeName + (struct_len + -6)," const",6), iVar1 == 0)) {
    typeName[struct_len + -6] = '\0';
  }
  return;
}

Assistant:

static void trim_name(char *typeName) {
            ecs_size_t len = ecs_os_strlen(typeName);
            
            /* Remove 'const' */
            ecs_size_t const_len = ecs_os_strlen("const ");
            if ((len > const_len) && !ecs_os_strncmp(typeName, "const ", const_len)) {
                ecs_os_memmove(typeName, typeName + const_len, len - const_len);
                typeName[len - const_len] = '\0';
                len -= const_len;
            }

            /* Remove 'struct' */
            ecs_size_t struct_len = ecs_os_strlen("struct ");
            if ((len > struct_len) && !ecs_os_strncmp(typeName, "struct ", struct_len)) {
                ecs_os_memmove(typeName, typeName + struct_len, len - struct_len);
                typeName[len - struct_len] = '\0';
                len -= struct_len;
            }

            /* Remove 'class' */
            ecs_size_t class_len = ecs_os_strlen("class ");
            if ((len > class_len) && !ecs_os_strncmp(typeName, "class ", class_len)) {
                ecs_os_memmove(typeName, typeName + class_len, len - class_len);
                typeName[len - class_len] = '\0';
                len -= class_len;
            }            

            while (typeName[len - 1] == ' ' ||
                   typeName[len - 1] == '&' ||
                   typeName[len - 1] == '*') 
            {
                len --;
                typeName[len] = '\0';
            }

            /* Remove const at end of string */
            if (len > const_len) {
                if (!ecs_os_strncmp(&typeName[len - const_len], " const", const_len)) {
                    typeName[len - const_len] = '\0';
                }
            }
        }